

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# art.cpp
# Opt level: O2

unsafe_optional_ptr<const_Node> __thiscall
duckdb::ART::Lookup(ART *this,Node *node,ARTKey *key,idx_t depth)

{
  ulong uVar1;
  reference<const_Node> node_00;
  bool bVar2;
  optional_idx oVar3;
  reference<const_Node> ref;
  reference<const_Node> local_40;
  idx_t local_38;
  
  local_40._M_data = node;
  local_38 = depth;
  while( true ) {
    node_00._M_data = local_40._M_data;
    uVar1 = ((local_40._M_data)->super_IndexPointer).data;
    if (uVar1 < 0x100000000000000) {
      return (unsafe_optional_ptr<const_Node>)(Node *)0x0;
    }
    bVar2 = Node::IsAnyLeaf(local_40._M_data);
    if ((long)uVar1 < 0) break;
    if (bVar2) {
      return (unsafe_optional_ptr<const_Node>)node_00._M_data;
    }
    if ((uVar1 & 0x7f00000000000000) == 0x100000000000000) {
      oVar3 = Prefix::Traverse(this,&local_40,key,&local_38);
      if (oVar3.index != 0xffffffffffffffff) {
        return (unsafe_optional_ptr<const_Node>)(Node *)0x0;
      }
    }
    else {
      local_40._M_data =
           (Node *)GetChildInternal<duckdb::Node_const>(this,node_00._M_data,key->data[local_38]);
      if (local_40._M_data == (Node *)0x0) {
        return (unsafe_optional_ptr<const_Node>)(Node *)0x0;
      }
      local_38 = local_38 + 1;
    }
  }
  return (unsafe_optional_ptr<const_Node>)node_00._M_data;
}

Assistant:

const unsafe_optional_ptr<const Node> ART::Lookup(const Node &node, const ARTKey &key, idx_t depth) {
	reference<const Node> ref(node);
	while (ref.get().HasMetadata()) {

		// Return the leaf.
		if (ref.get().IsAnyLeaf() || ref.get().GetGateStatus() == GateStatus::GATE_SET) {
			return unsafe_optional_ptr<const Node>(ref.get());
		}

		// Traverse the prefix.
		if (ref.get().GetType() == NType::PREFIX) {
			auto pos = Prefix::Traverse(*this, ref, key, depth);
			if (pos.IsValid()) {
				// Prefix mismatch, return nullptr.
				return nullptr;
			}
			continue;
		}

		// Get the child node.
		D_ASSERT(depth < key.len);
		auto child = ref.get().GetChild(*this, key[depth]);

		// No child at the matching byte, return nullptr.
		if (!child) {
			return nullptr;
		}

		// Continue in the child.
		ref = *child;
		D_ASSERT(ref.get().HasMetadata());
		depth++;
	}

	return nullptr;
}